

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ed25519_asn1.cc
# Opt level: O1

int ed25519_get_pub_raw(EVP_PKEY *pkey,uint8_t *out,size_t *out_len)

{
  void *pvVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  
  if (out != (uint8_t *)0x0) {
    if (*out_len < 0x20) {
      ERR_put_error(6,0,100,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_ed25519_asn1.cc"
                    ,0x6b);
      return 0;
    }
    pvVar1 = pkey->pkey;
    uVar2 = *(undefined8 *)((long)pvVar1 + 0x20);
    uVar3 = *(undefined8 *)((long)pvVar1 + 0x28);
    uVar4 = *(undefined8 *)((long)pvVar1 + 0x38);
    *(undefined8 *)(out + 0x10) = *(undefined8 *)((long)pvVar1 + 0x30);
    *(undefined8 *)(out + 0x18) = uVar4;
    *(undefined8 *)out = uVar2;
    *(undefined8 *)(out + 8) = uVar3;
  }
  *out_len = 0x20;
  return 1;
}

Assistant:

static int ed25519_get_pub_raw(const EVP_PKEY *pkey, uint8_t *out,
                               size_t *out_len) {
  const ED25519_KEY *key = reinterpret_cast<const ED25519_KEY *>(pkey->pkey);
  if (out == NULL) {
    *out_len = 32;
    return 1;
  }

  if (*out_len < 32) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_BUFFER_TOO_SMALL);
    return 0;
  }

  OPENSSL_memcpy(out, key->key + ED25519_PUBLIC_KEY_OFFSET, 32);
  *out_len = 32;
  return 1;
}